

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O0

SampleInfo * __thiscall Triangle::sampleSurface(Triangle *this,Sampler *sampler)

{
  long *in_RDX;
  long in_RSI;
  SampleInfo *in_RDI;
  undefined4 uVar1;
  undefined8 extraout_XMM0_Qb;
  vec3f vVar2;
  vec3f p;
  vec2f t;
  undefined4 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe98 [16];
  undefined1 auVar3 [16];
  
  uVar1 = (**(code **)(*in_RDX + 0x20))();
  vVar2 = ::operator-(in_stack_fffffffffffffe98._8_8_,in_stack_fffffffffffffe98._0_8_);
  auVar3._8_4_ = (int)extraout_XMM0_Qb;
  auVar3._0_8_ = vVar2._0_8_;
  auVar3._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  ::operator*(vVar2.x,(vec3f *)CONCAT44(uVar1,in_stack_fffffffffffffe90));
  ::operator+(auVar3._8_8_,auVar3._0_8_);
  ::operator-(auVar3._8_8_,auVar3._0_8_);
  ::operator*(auVar3._0_4_,(vec3f *)CONCAT44(uVar1,in_stack_fffffffffffffe90));
  vVar2 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  Primitive::SampleInfo::SampleInfo
            (in_RDI,vVar2,*(vec3f *)(in_RSI + 0x8c),
             *(float *)(in_RSI + 0x98) + *(float *)(in_RSI + 0x98));
  return in_RDI;
}

Assistant:

SampleInfo sampleSurface(Sampler& sampler) const
	{
		vec2f t = sampler.sampleUnitTriangle();
		vec3f p = v1 + t.x * (v2-v1) + t.y * (v3-v1);
		return SampleInfo(p, planeNormal, 2 * one_by_2S);
	}